

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall
TTD::EventLog::RecordJsRTSetException
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var var,
          bool propagateToDebugger)

{
  EventLogEntry *pEVar1;
  undefined7 in_register_00000009;
  JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *local_30;
  JsRTSingleVarScalarArgumentAction *spAction;
  
  local_30 = (JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *)0x0;
  pEVar1 = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)44>
                     (this,&local_30);
  local_30->VarArray[0] = var;
  local_30->ScalarArray[0] = CONCAT71(in_register_00000009,propagateToDebugger) & 0xffffffff;
  if (actionPopper->m_actionEvent == (EventLogEntry *)0x0) {
    actionPopper->m_actionEvent = pEVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Don\'t double initialize");
}

Assistant:

void EventLog::RecordJsRTSetException(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var var, bool propagateToDebugger)
    {
        NSLogEvents::JsRTSingleVarScalarArgumentAction* spAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTSingleVarScalarArgumentAction, NSLogEvents::EventKind::SetExceptionActionTag>(&spAction);
        NSLogEvents::SetVarItem_0(spAction, TTD_CONVERT_JSVAR_TO_TTDVAR(var));
        NSLogEvents::SetScalarItem_0(spAction, propagateToDebugger);

        actionPopper.InitializeWithEventAndEnter(evt);
    }